

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O0

SnapObjectType __thiscall Js::RuntimeFunction::GetSnapTag_TTD(RuntimeFunction *this)

{
  int iVar1;
  ScriptContext *pSVar2;
  RuntimeFunction *function;
  Var revokableProxy;
  RuntimeFunction *this_local;
  
  function = (RuntimeFunction *)0x0;
  revokableProxy = this;
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  iVar1 = (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (this,this,0xd,&function,0,pSVar2);
  if (iVar1 == 0) {
    this_local._4_4_ = SnapRuntimeFunctionObject;
  }
  else {
    this_local._4_4_ = SnapRuntimeRevokerFunctionObject;
  }
  return this_local._4_4_;
}

Assistant:

TTD::NSSnapObjects::SnapObjectType RuntimeFunction::GetSnapTag_TTD() const
    {
        Var revokableProxy = nullptr;
        RuntimeFunction* function = const_cast<RuntimeFunction*>(this);
        if(function->GetInternalProperty(function, Js::InternalPropertyIds::RevocableProxy, &revokableProxy, nullptr, this->GetScriptContext()))
        {
            return TTD::NSSnapObjects::SnapObjectType::SnapRuntimeRevokerFunctionObject;
        }
        else
        {
            return TTD::NSSnapObjects::SnapObjectType::SnapRuntimeFunctionObject;
        }
    }